

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O0

void Omega_h::fill_right(Write<int> *a)

{
  char *file;
  undefined1 local_12a;
  undefined1 local_129;
  identity<int> transform;
  void *pvStack_128;
  maximum<int> op;
  int *result;
  int *last;
  int *first;
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [39];
  ScopedTimer local_71;
  Write<int> *pWStack_70;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> *a_local;
  ulong local_10;
  
  pWStack_70 = a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,&local_d9);
  std::operator+(local_b8,(char *)local_d8);
  std::__cxx11::to_string((__cxx11 *)&first,0x1a);
  std::operator+(local_98,local_b8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_71,"fill_right",file);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if (((ulong)(a->shared_alloc_).alloc & 1) == 0) {
    local_10 = ((a->shared_alloc_).alloc)->size;
  }
  else {
    local_10 = (ulong)(a->shared_alloc_).alloc >> 3;
  }
  pvStack_128 = (a->shared_alloc_).direct_ptr;
  local_129 = 0;
  local_12a = 0;
  transform_inclusive_scan<int*,int*,Omega_h::maximum<int>,Omega_h::identity<int>>
            ((a->shared_alloc_).direct_ptr,
             (void *)((long)(a->shared_alloc_).direct_ptr + (long)(int)(local_10 >> 2) * 4),
             pvStack_128,&local_12a);
  ScopedTimer::~ScopedTimer(&local_71);
  return;
}

Assistant:

void fill_right(Write<LO> a) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = a.begin();
  auto const last = a.end();
  auto const result = a.begin();
  auto const op = maximum<LO>();
  auto transform = identity<LO>();
  transform_inclusive_scan(first, last, result, op, std::move(transform));
}